

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  uint maxSymbolValue_00;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  size_t workSpaceSize;
  void *dst_00;
  S16 norm [256];
  uint count [256];
  uint local_65c;
  void *local_658;
  size_t local_650;
  size_t local_648;
  void *local_640;
  short local_638 [256];
  uint local_438 [258];
  
  iVar3 = 1 << ((char)tableLog - 1U & 0x1f);
  iVar8 = 0x400;
  if (0xc < tableLog) {
    iVar8 = 1 << ((char)tableLog - 2U & 0x1f);
  }
  if (wkspSize < iVar8 + iVar3 + maxSymbolValue * 2 + 3) {
    return 0xffffffffffffffd4;
  }
  if (srcSize < 2) {
    return 0;
  }
  uVar5 = (ulong)(iVar3 + maxSymbolValue * 2 + 3);
  local_640 = (void *)((long)workSpace + uVar5 * 4);
  workSpaceSize = wkspSize + uVar5 * -4;
  local_65c = maxSymbolValue;
  if (maxSymbolValue == 0) {
    local_65c = 0xff;
  }
  uVar4 = 0xb;
  if (tableLog != 0) {
    uVar4 = tableLog;
  }
  local_650 = dstSize;
  sVar6 = HIST_count_wksp(local_438,&local_65c,src,srcSize,local_640,workSpaceSize);
  maxSymbolValue_00 = local_65c;
  if (sVar6 < 0xffffffffffffff89) {
    if (sVar6 != srcSize) {
      bVar2 = sVar6 != 1 && srcSize >> 7 <= sVar6;
      sVar6 = 0;
      goto LAB_0010f9c0;
    }
    sVar6 = 1;
  }
  bVar2 = false;
LAB_0010f9c0:
  sVar7 = sVar6;
  if (bVar2) {
    local_658 = dst;
    uVar4 = FSE_optimalTableLog_internal(uVar4,srcSize,local_65c,2);
    sVar7 = FSE_normalizeCount(local_638,uVar4,local_438,srcSize,maxSymbolValue_00);
    if (((sVar7 < 0xffffffffffffff89) &&
        (sVar7 = FSE_writeNCount(local_658,local_650,local_638,maxSymbolValue_00,uVar4),
        sVar7 < 0xffffffffffffff89)) &&
       (local_648 = sVar7,
       sVar7 = FSE_buildCTable_wksp
                         ((FSE_CTable *)workSpace,local_638,maxSymbolValue_00,uVar4,local_640,
                          workSpaceSize), pvVar1 = local_658, sVar7 < 0xffffffffffffff89)) {
      dst_00 = (void *)((long)local_658 + local_648);
      sVar7 = FSE_compress_usingCTable
                        (dst_00,local_650 - local_648,src,srcSize,(FSE_CTable *)workSpace);
      if (sVar7 < 0xffffffffffffff89) {
        if (sVar7 == 0) {
          bVar2 = false;
          sVar7 = 0;
        }
        else {
          dst_00 = (void *)((long)dst_00 + sVar7);
          bVar2 = true;
          sVar7 = sVar6;
        }
      }
      else {
        bVar2 = false;
      }
      if (bVar2) {
        sVar7 = 0;
        if ((ulong)((long)dst_00 - (long)pvVar1) < srcSize - 1) {
          sVar7 = (long)dst_00 - (long)pvVar1;
        }
      }
    }
  }
  return sVar7;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    unsigned count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, scratchBuffer, scratchBufferSize) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}